

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O3

bool __thiscall QDecompressHelper::countInternal(QDecompressHelper *this,QByteDataBuffer *buffer)

{
  bool bVar1;
  pointer __p_00;
  qint64 qVar2;
  QDecompressHelper *pQVar3;
  pointer __p;
  long in_FS_OFFSET;
  _Head_base<0UL,_QDecompressHelper_*,_false> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = true;
  if (this->countDecompressed == true) {
    pQVar3 = (this->countHelper)._M_t.
             super___uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_>._M_t.
             super__Tuple_impl<0UL,_QDecompressHelper_*,_std::default_delete<QDecompressHelper>_>.
             super__Head_base<0UL,_QDecompressHelper_*,_false>._M_head_impl;
    if (pQVar3 == (QDecompressHelper *)0x0) {
      __p_00 = (pointer)operator_new(0xc0);
      memset(__p_00,0,0xa8);
      __p_00->MaxDecompressedDataBufferSize = 0xa00000;
      (__p_00->countHelper)._M_t.
      super___uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_>._M_t.
      super__Tuple_impl<0UL,_QDecompressHelper_*,_std::default_delete<QDecompressHelper>_>.
      super__Head_base<0UL,_QDecompressHelper_*,_false>._M_head_impl = (QDecompressHelper *)0x0;
      (__p_00->errorStr).d.d = (Data *)0x0;
      (__p_00->errorStr).d.ptr = (char16_t *)0x0;
      (__p_00->errorStr).d.size = 0;
      __p_00->archiveBombCheckThreshold = 0xa00000;
      __p_00->totalUncompressedBytes = 0;
      __p_00->totalCompressedBytes = 0;
      *(undefined8 *)((long)&__p_00->totalCompressedBytes + 4) = 0;
      *(undefined8 *)((long)&__p_00->totalBytesRead + 4) = 0;
      __p_00->decoderPointer = (void *)0x0;
      __p_00->brotliUnconsumedDataPtr = (uint8_t *)0x0;
      __p_00->brotliUnconsumedAmount = 0;
      local_40._M_head_impl = (QDecompressHelper *)0x0;
      std::__uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_>::reset
                ((__uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *)
                 &this->countHelper,__p_00);
      std::unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_>::~unique_ptr
                ((unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *)&local_40
                );
      pQVar3 = (this->countHelper)._M_t.
               super___uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_>.
               _M_t.
               super__Tuple_impl<0UL,_QDecompressHelper_*,_std::default_delete<QDecompressHelper>_>.
               super__Head_base<0UL,_QDecompressHelper_*,_false>._M_head_impl;
      qVar2 = 0x7fffffffffffffff;
      if (this->archiveBombCheckThreshold != -1) {
        qVar2 = this->archiveBombCheckThreshold;
      }
      pQVar3->archiveBombCheckThreshold = qVar2;
      setEncoding(pQVar3,this->contentEncoding);
      pQVar3 = (this->countHelper)._M_t.
               super___uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_>.
               _M_t.
               super__Tuple_impl<0UL,_QDecompressHelper_*,_std::default_delete<QDecompressHelper>_>.
               super__Head_base<0UL,_QDecompressHelper_*,_false>._M_head_impl;
    }
    feed(pQVar3,buffer);
    bVar1 = countInternal(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QDecompressHelper::countInternal(const QByteDataBuffer &buffer)
{
    if (countDecompressed) {
        if (!countHelper) {
            countHelper = std::make_unique<QDecompressHelper>();
            countHelper->setDecompressedSafetyCheckThreshold(archiveBombCheckThreshold);
            countHelper->setEncoding(contentEncoding);
        }
        countHelper->feed(buffer);
        return countInternal();
    }
    return true;
}